

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_curve.cxx
# Opt level: O2

void __thiscall
Fl_Graphics_Driver::curve
          (Fl_Graphics_Driver *this,double X0,double Y0,double X1,double Y1,double X2,double Y2,
          double X3,double Y3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 local_98 [16];
  undefined1 local_68 [64];
  undefined4 local_28;
  
  dVar14 = fl_transform_x(X0,Y0);
  dVar1 = fl_transform_y(X0,Y0);
  local_98._8_4_ = extraout_XMM0_Dc;
  local_98._0_8_ = dVar1;
  local_98._12_4_ = extraout_XMM0_Dd;
  local_28 = SUB84(dVar14,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x29])(local_28,SUB84(dVar1,0));
  dVar12 = fl_transform_x(X1,Y1);
  dVar13 = fl_transform_y(X1,Y1);
  dVar2 = fl_transform_x(X2,Y2);
  dVar3 = fl_transform_y(X2,Y2);
  dVar4 = fl_transform_x(X3,Y3);
  dVar5 = fl_transform_y(X3,Y3);
  dVar6 = ABS(-(dVar1 - dVar3) * (dVar4 - dVar12) + (dVar5 - dVar13) * (dVar14 - dVar2));
  dVar15 = ABS(-(dVar1 - dVar5) * (dVar2 - dVar12) + (dVar3 - dVar13) * (dVar14 - dVar4));
  if (dVar15 <= dVar6) {
    dVar15 = dVar6;
  }
  uVar7 = (uint)(SQRT(dVar15) * 0.25);
  if (1 < (int)uVar7) {
    uVar8 = 100;
    if (uVar7 < 100) {
      uVar8 = uVar7;
    }
    dVar6 = 1.0 / (double)(int)uVar8;
    dVar15 = (dVar12 * 3.0 + dVar2 * -3.0 + dVar4) - dVar14;
    dVar17 = (dVar13 * 3.0 + dVar3 * -3.0 + dVar5) - dVar1;
    dVar2 = (dVar14 + (dVar2 - (dVar12 + dVar12))) * 3.0;
    dVar3 = (dVar1 + (dVar3 - (dVar13 + dVar13))) * 3.0;
    dVar16 = dVar15 * 6.0 * dVar6 * dVar6 * dVar6;
    dVar18 = dVar17 * 6.0 * dVar6 * dVar6 * dVar6;
    dVar12 = ((dVar15 * dVar6 + dVar2) * dVar6 + (dVar12 - dVar14) * 3.0) * dVar6;
    dVar13 = ((dVar17 * dVar6 + dVar3) * dVar6 + (dVar13 - dVar1) * 3.0) * dVar6;
    dVar1 = (dVar3 + dVar3) * dVar6 * dVar6 + dVar18;
    local_68._8_4_ = SUB84(dVar1,0);
    local_68._0_8_ = (dVar2 + dVar2) * dVar6 * dVar6 + dVar16;
    local_68._12_4_ = (int)((ulong)dVar1 >> 0x20);
    iVar9 = uVar8 - 2;
    while( true ) {
      dVar14 = dVar14 + dVar12;
      bVar10 = iVar9 == 0;
      iVar9 = iVar9 + -1;
      if (bVar10) break;
      uVar11 = local_98._12_4_;
      dVar2 = (double)local_98._0_8_ + dVar13;
      dVar12 = dVar12 + (double)local_68._0_8_;
      dVar13 = dVar13 + (double)local_68._8_8_;
      dVar1 = (double)local_68._8_8_ + dVar18;
      local_68._8_4_ = SUB84(dVar1,0);
      local_68._0_8_ = (double)local_68._0_8_ + dVar16;
      local_68._12_4_ = (int)((ulong)dVar1 >> 0x20);
      local_98._8_4_ = local_98._8_4_;
      local_98._0_8_ = dVar2;
      local_98._12_4_ = uVar11;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x29])(SUB84(dVar14,0));
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x29])
              (SUB84(dVar14,0),SUB84((double)local_98._0_8_ + dVar13,0));
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x29])(SUB84(dVar4,0),SUB84(dVar5,0));
  return;
}

Assistant:

void Fl_Graphics_Driver::curve(double X0, double Y0,
	      double X1, double Y1,
	      double X2, double Y2,
	      double X3, double Y3) {

  double x = fl_transform_x(X0,Y0);
  double y = fl_transform_y(X0,Y0);

  // draw point 0:
  fl_transformed_vertex(x,y);

  double x1 = fl_transform_x(X1,Y1);
  double yy1 = fl_transform_y(X1,Y1);
  double x2 = fl_transform_x(X2,Y2);
  double y2 = fl_transform_y(X2,Y2);
  double x3 = fl_transform_x(X3,Y3);
  double y3 = fl_transform_y(X3,Y3);

  // find the area:
  double a = fabs((x-x2)*(y3-yy1)-(y-y2)*(x3-x1));
  double b = fabs((x-x3)*(y2-yy1)-(y-y3)*(x2-x1));
  if (b > a) a = b;

  // use that to guess at the number of segments:
  int n = int(sqrt(a)/4);
  if (n > 1) {
    if (n > 100) n = 100; // make huge curves not hang forever

    double e = 1.0/n;

    // calculate the coefficients of 3rd order equation:
    double xa = (x3-3*x2+3*x1-x);
    double xb = 3*(x2-2*x1+x);
    double xc = 3*(x1-x);
    // calculate the forward differences:
    double dx1 = ((xa*e+xb)*e+xc)*e;
    double dx3 = 6*xa*e*e*e;
    double dx2 = dx3 + 2*xb*e*e;

    // calculate the coefficients of 3rd order equation:
    double ya = (y3-3*y2+3*yy1-y);
    double yb = 3*(y2-2*yy1+y);
    double yc = 3*(yy1-y);
    // calculate the forward differences:
    double dy1 = ((ya*e+yb)*e+yc)*e;
    double dy3 = 6*ya*e*e*e;
    double dy2 = dy3 + 2*yb*e*e;

    // draw points 1 .. n-2:
    for (int m=2; m<n; m++) {
      x += dx1;
      dx1 += dx2;
      dx2 += dx3;
      y += dy1;
      dy1 += dy2;
      dy2 += dy3;
      fl_transformed_vertex(x,y);
    }

    // draw point n-1:
    fl_transformed_vertex(x+dx1, y+dy1);
  }

  // draw point n:
  fl_transformed_vertex(x3,y3);
}